

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.h
# Opt level: O0

bool __thiscall CmdLineArgsParser::IsHexDigit(CmdLineArgsParser *this)

{
  char16 cVar1;
  bool local_1a;
  CmdLineArgsParser *this_local;
  
  cVar1 = CurChar(this);
  if ((0x2f < (ushort)cVar1) && (cVar1 = CurChar(this), (ushort)cVar1 < 0x3a)) {
    return true;
  }
  cVar1 = CurChar(this);
  if ((0x40 < (ushort)cVar1) && (cVar1 = CurChar(this), (ushort)cVar1 < 0x47)) {
    return true;
  }
  cVar1 = CurChar(this);
  local_1a = false;
  if (0x60 < (ushort)cVar1) {
    cVar1 = CurChar(this);
    local_1a = (ushort)cVar1 < 0x67;
  }
  return local_1a;
}

Assistant:

bool IsHexDigit()
            {
                return (CurChar() >= '0' && CurChar() <= '9') ||
                    (CurChar() >= 'A' && CurChar() <= 'F') ||
                    (CurChar() >= 'a' && CurChar() <= 'f');
            }